

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChNodeFEAxyzrot *this,ChFrame<double> *initialf)

{
  undefined1 *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> local_d8;
  ChFrame<double> local_b8;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x2b8);
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b2c638;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb54b08;
  *(undefined8 *)&this->field_0x2b8 = 0xb54c08;
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            ((ChFrameMoving<double> *)this_00,&local_d8,(ChQuaternion<double> *)&local_b8);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb54618;
  *(undefined8 *)&this->field_0x2b8 = 0xb549f8;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0xb54788;
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x228);
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb548b0;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  (this->X0)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->X0).coord.pos.m_data[0] = 0.0;
  (this->X0).coord.pos.m_data[1] = 0.0;
  (this->X0).coord.pos.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[0] = 1.0;
  (this->X0).coord.rot.m_data[1] = 0.0;
  (this->X0).coord.rot.m_data[2] = 0.0;
  (this->X0).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->X0).Amatrix,(ChQuaternion<double> *)&local_b8);
  dVar1 = VNULL;
  (this->Force).m_data[0] = VNULL;
  dVar2 = DAT_00b90ac0;
  (this->Force).m_data[1] = DAT_00b90ac0;
  dVar3 = DAT_00b90ac8;
  (this->Force).m_data[2] = DAT_00b90ac8;
  (this->Torque).m_data[0] = dVar1;
  (this->Torque).m_data[1] = dVar2;
  (this->Torque).m_data[2] = dVar3;
  ChFrameMoving<double>::operator=((ChFrameMoving<double> *)this_00,initialf);
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b8.coord.pos.m_data[0] = (initialf->coord).pos.m_data[0];
  local_b8.coord.pos.m_data[1] = (initialf->coord).pos.m_data[1];
  local_b8.coord.pos.m_data[2] = (initialf->coord).pos.m_data[2];
  local_b8.coord.rot.m_data[0] = (initialf->coord).rot.m_data[0];
  local_b8.coord.rot.m_data[1] = (initialf->coord).rot.m_data[1];
  local_b8.coord.rot.m_data[2] = (initialf->coord).rot.m_data[2];
  local_b8.coord.rot.m_data[3] = (initialf->coord).rot.m_data[3];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (initialf->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChFrame<double>::operator=(&this->X0,&local_b8);
  ChVariablesBodyOwnMass::SetBodyMass(&this->variables,0.0);
  (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 0.0;
  return;
}

Assistant:

ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChFrame<> initialf) : Force(VNULL), Torque(VNULL) {
    this->Frame() = initialf;
    X0 = ChFrame<>(initialf);

    variables.SetBodyMass(0.0);
    variables.GetBodyInertia().setZero();
}